

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::processNameChar(TestSpecParser *this,char c)

{
  bool bVar1;
  char in_SIL;
  TestSpecParser *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  if (in_SIL == '[') {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(0x5b,in_stack_fffffffffffffff0),(char *)in_RDI);
    if (bVar1) {
      in_RDI->m_exclusion = true;
    }
    else {
      endMode((TestSpecParser *)CONCAT17(in_SIL,in_stack_fffffffffffffff0));
    }
    startNewMode(in_RDI,Tag);
  }
  return;
}

Assistant:

void TestSpecParser::processNameChar( char c ) {
        if( c == '[' ) {
            if( m_substring == "exclude:" )
                m_exclusion = true;
            else
                endMode();
            startNewMode( Tag );
        }
    }